

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

Var Js::JavascriptFunction::FinishConstructor
              (Var constructorReturnValue,Var newObject,JavascriptFunction *function,
              bool hasOverridingNewTarget)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ConstructorCache *this;
  ScriptContext *requestContext;
  bool hasOverridingNewTarget_local;
  JavascriptFunction *function_local;
  Var newObject_local;
  Var constructorReturnValue_local;
  
  if (constructorReturnValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x3df,"(constructorReturnValue)","constructorReturnValue");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVar3 = Js::JavascriptOperators::IsObject(constructorReturnValue);
  function_local = (JavascriptFunction *)newObject;
  if (BVar3 != 0) {
    function_local = (JavascriptFunction *)constructorReturnValue;
  }
  if (function != (JavascriptFunction *)0x0) {
    this = GetConstructorCache(function);
    bVar2 = ConstructorCache::NeedsUpdateAfterCtor(this);
    if ((bVar2) && (!hasOverridingNewTarget)) {
      requestContext = RecyclableObject::GetScriptContext((RecyclableObject *)function);
      Js::JavascriptOperators::UpdateNewScObjectCache(function,function_local,requestContext);
    }
  }
  return function_local;
}

Assistant:

Var JavascriptFunction::FinishConstructor(
        const Var constructorReturnValue,
        Var newObject,
        JavascriptFunction *const function,
        bool hasOverridingNewTarget)
    {
        Assert(constructorReturnValue);

        // CONSIDER: Using constructorCache->ctorHasNoExplicitReturnValue to speed up this interpreter code path.
        if (JavascriptOperators::IsObject(constructorReturnValue))
        {
            newObject = constructorReturnValue;
        }

        // #3217: Cases with overriding newTarget are not what constructor cache is intended for;
        //     Bypass constructor cache to avoid prototype mismatch/confusion.
        if (function && function->GetConstructorCache()->NeedsUpdateAfterCtor() && !hasOverridingNewTarget)
        {
            JavascriptOperators::UpdateNewScObjectCache(function, newObject, function->GetScriptContext());
        }

        return newObject;
    }